

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O0

_Bool trans_VCVT_dp_int(DisasContext_conflict1 *s,arg_VCVT_dp_int *a)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  TCGv_ptr arg2;
  TCGv_i64 var;
  TCGv_i32 retval;
  TCGv_ptr fpst;
  TCGv_i64 vm;
  TCGv_i32 vd;
  TCGContext_conflict1 *tcg_ctx;
  arg_VCVT_dp_int *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  _Var1 = isar_feature_aa32_fpdp_v2(s->isar);
  if (_Var1) {
    _Var1 = isar_feature_aa32_simd_r32(s->isar);
    if ((_Var1) || ((a->vm & 0x10U) == 0)) {
      _Var1 = vfp_access_check(s);
      if (_Var1) {
        arg2 = get_fpstatus_ptr_aarch64(tcg_ctx_00,0);
        var = tcg_temp_new_i64(tcg_ctx_00);
        retval = tcg_temp_new_i32(tcg_ctx_00);
        neon_load_reg64(tcg_ctx_00,var,a->vm);
        if (a->s == 0) {
          if (a->rz == 0) {
            gen_helper_vfp_touid(tcg_ctx_00,retval,var,arg2);
          }
          else {
            gen_helper_vfp_touizd(tcg_ctx_00,retval,var,arg2);
          }
        }
        else if (a->rz == 0) {
          gen_helper_vfp_tosid(tcg_ctx_00,retval,var,arg2);
        }
        else {
          gen_helper_vfp_tosizd(tcg_ctx_00,retval,var,arg2);
        }
        neon_store_reg32(tcg_ctx_00,retval,a->vd);
        tcg_temp_free_i32(tcg_ctx_00,retval);
        tcg_temp_free_i64(tcg_ctx_00,var);
        tcg_temp_free_ptr(tcg_ctx_00,arg2);
        s_local._7_1_ = true;
      }
      else {
        s_local._7_1_ = true;
      }
    }
    else {
      s_local._7_1_ = false;
    }
  }
  else {
    s_local._7_1_ = false;
  }
  return s_local._7_1_;
}

Assistant:

static bool trans_VCVT_dp_int(DisasContext *s, arg_VCVT_dp_int *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 vd;
    TCGv_i64 vm;
    TCGv_ptr fpst;

    if (!dc_isar_feature(aa32_fpdp_v2, s)) {
        return false;
    }

    /* UNDEF accesses to D16-D31 if they don't exist. */
    if (!dc_isar_feature(aa32_simd_r32, s) && (a->vm & 0x10)) {
        return false;
    }

    if (!vfp_access_check(s)) {
        return true;
    }

    fpst = get_fpstatus_ptr(tcg_ctx, false);
    vm = tcg_temp_new_i64(tcg_ctx);
    vd = tcg_temp_new_i32(tcg_ctx);
    neon_load_reg64(tcg_ctx, vm, a->vm);

    if (a->s) {
        if (a->rz) {
            gen_helper_vfp_tosizd(tcg_ctx, vd, vm, fpst);
        } else {
            gen_helper_vfp_tosid(tcg_ctx, vd, vm, fpst);
        }
    } else {
        if (a->rz) {
            gen_helper_vfp_touizd(tcg_ctx, vd, vm, fpst);
        } else {
            gen_helper_vfp_touid(tcg_ctx, vd, vm, fpst);
        }
    }
    neon_store_reg32(tcg_ctx, vd, a->vd);
    tcg_temp_free_i32(tcg_ctx, vd);
    tcg_temp_free_i64(tcg_ctx, vm);
    tcg_temp_free_ptr(tcg_ctx, fpst);
    return true;
}